

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar25;
  int iVar26;
  int iVar27;
  parasail_result_t *ppVar28;
  __m128i *ptr;
  __m128i *palVar29;
  __m128i *b;
  __m128i *palVar30;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *b_01;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_03;
  uint uVar31;
  size_t len;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  long lVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  __m128i *ptr_04;
  long lVar40;
  undefined2 uVar41;
  long lVar42;
  uint uVar43;
  undefined4 uVar45;
  undefined4 uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ushort uVar53;
  ushort uVar56;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar59;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ulong uVar75;
  ushort uVar76;
  ulong uVar77;
  ushort uVar80;
  ushort uVar81;
  ushort uVar83;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar78 [16];
  ushort uVar82;
  ushort uVar88;
  undefined1 auVar79 [16];
  ulong uVar84;
  ushort uVar90;
  ushort uVar94;
  ushort uVar96;
  ushort uVar97;
  ushort uVar99;
  ushort uVar100;
  ushort uVar102;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ushort uVar95;
  ushort uVar98;
  ushort uVar101;
  ushort uVar103;
  ushort uVar104;
  undefined1 auVar93 [16];
  short sVar105;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  undefined1 in_XMM5 [16];
  undefined1 auVar106 [16];
  short sVar114;
  undefined1 auVar107 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  short sVar119;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  undefined1 in_XMM10 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  short sVar128;
  undefined4 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar133;
  int iVar135;
  int iVar136;
  int iVar137;
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 in_XMM15 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  undefined1 local_198 [16];
  ushort local_188;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_180;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  __m128i *local_158;
  __m128i *local_148;
  undefined8 uStack_140;
  __m128i *local_108;
  undefined8 uStack_100;
  ushort local_a8;
  ushort uStack_a6;
  ushort local_68;
  ushort uStack_66;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX;
  short sVar44;
  short sVar54;
  short sVar55;
  short sVar57;
  short sVar58;
  short sVar60;
  short sVar61;
  short sVar62;
  ushort uVar87;
  ushort uVar89;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar31 = profile->s1Len;
        if ((int)uVar31 < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_1();
        }
        else {
          uVar43 = uVar31 - 1;
          uVar33 = (ulong)uVar31 + 7 >> 3;
          uVar48 = (ulong)uVar43 % uVar33;
          iVar26 = (int)(uVar43 / uVar33);
          iVar36 = -open;
          iVar27 = ppVar5->min;
          iVar34 = -iVar27;
          if (iVar27 != iVar36 && SBORROW4(iVar27,iVar36) == iVar27 + open < 0) {
            iVar34 = open;
          }
          pvVar6 = (profile->profile16).matches;
          iVar27 = ppVar5->max;
          pvVar7 = (profile->profile16).similar;
          ppVar28 = parasail_result_new_rowcol3((uint)((ulong)uVar31 + 7) & 0x7ffffff8,s2Len);
          if (ppVar28 != (parasail_result_t *)0x0) {
            ppVar28->flag = ppVar28->flag | 0x8250801;
            ptr = parasail_memalign___m128i(0x10,uVar33);
            palVar29 = parasail_memalign___m128i(0x10,uVar33);
            uStack_140 = local_148;
            local_148 = palVar29;
            b = parasail_memalign___m128i(0x10,uVar33);
            palVar30 = parasail_memalign___m128i(0x10,uVar33);
            uStack_100 = local_108;
            local_108 = palVar30;
            b_00 = parasail_memalign___m128i(0x10,uVar33);
            ptr_00 = parasail_memalign___m128i(0x10,uVar33);
            b_01 = parasail_memalign___m128i(0x10,uVar33);
            ptr_01 = parasail_memalign___m128i(0x10,uVar33);
            ptr_02 = parasail_memalign___m128i(0x10,uVar33);
            b_02 = parasail_memalign___m128i(0x10,uVar33);
            b_03 = parasail_memalign___m128i(0x10,uVar33);
            b_04 = parasail_memalign___m128i(0x10,uVar33);
            ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar91 = (undefined1  [16])0x0;
            len = CONCAT71((int7)((ulong)palVar29 >> 8),ptr_02 == (__m128i *)0x0);
            c[1]._1_7_ = (undefined7)((ulong)palVar30 >> 8);
            c[1]._0_1_ = b_03 == (__m128i *)0x0;
            auVar49._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar49._8_8_ = -(ulong)(palVar29 == (__m128i *)0x0);
            auVar69._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar69._8_8_ = -(ulong)(palVar30 == (__m128i *)0x0);
            auVar49 = packssdw(auVar49,auVar69);
            auVar92._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar92._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar106._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar106._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar69 = packssdw(auVar92,auVar106);
            auVar49 = packssdw(auVar49,auVar69);
            if (((((b_02 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_03 != (__m128i *)0x0)
                 && b_04 != (__m128i *)0x0) && ptr_03 != (int16_t *)0x0) &&
                ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar49 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar49 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar49 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar49 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar49 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar49 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar49 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar49[0xf])) {
              iVar37 = s2Len + -1;
              auVar49 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar45 = auVar49._0_4_;
              auVar49 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar46 = auVar49._0_4_;
              auVar49 = pshuflw(ZEXT416(iVar34 - 0x7fff),ZEXT416(iVar34 - 0x7fff),0);
              local_a8 = auVar49._0_2_;
              uStack_a6 = auVar49._2_2_;
              auVar69 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar6 >> 0x10),0x7ffe - (short)iVar27)
                               );
              auVar69 = pshuflw(auVar69,auVar69,0);
              c[0] = uVar33;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar33;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar33;
              parasail_memset___m128i(b_01,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar33;
              parasail_memset___m128i(b_02,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar33;
              parasail_memset___m128i(b_03,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar33;
              parasail_memset___m128i(b_04,c_04,len);
              lVar32 = (long)iVar36;
              uVar35 = 0;
              do {
                lVar39 = 0;
                lVar38 = lVar32;
                do {
                  uVar41 = 0x8000;
                  if (-0x8000 < lVar38) {
                    uVar41 = (undefined2)lVar38;
                  }
                  *(undefined2 *)((long)&local_48 + lVar39 * 2) = uVar41;
                  lVar42 = lVar38 - (ulong)(uint)open;
                  if (lVar42 < -0x7fff) {
                    lVar42 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar39 * 2) = (short)lVar42;
                  lVar39 = lVar39 + 1;
                  lVar38 = lVar38 - uVar33 * (uint)gap;
                } while (lVar39 != 8);
                ptr[uVar35][0] = local_48;
                ptr[uVar35][1] = lStack_40;
                ptr_02[uVar35][0] = local_58;
                ptr_02[uVar35][1] = lStack_50;
                uVar35 = uVar35 + 1;
                lVar32 = lVar32 - (ulong)(uint)gap;
              } while (uVar35 != uVar33);
              *ptr_03 = 0;
              auVar116 = _DAT_00906ca0;
              lVar32 = (ulong)(uint)s2Len - 1;
              auVar50._8_4_ = (int)lVar32;
              auVar50._0_8_ = lVar32;
              auVar50._12_4_ = (int)((ulong)lVar32 >> 0x20);
              auVar70._4_4_ = gap;
              auVar70._0_4_ = gap;
              auVar70._8_4_ = gap;
              auVar70._12_4_ = gap;
              iVar27 = -gap;
              iVar34 = 0;
              auVar92 = pmovsxbq(auVar91,0x504);
              auVar106 = pmovsxbq(in_XMM5,0x302);
              auVar91 = pmovsxbq(in_XMM6,0x100);
              auVar50 = auVar50 ^ _DAT_00906ca0;
              auVar132._8_4_ = 0xffffffff;
              auVar132._0_8_ = 0xffffffffffffffff;
              auVar132._12_4_ = 0xffffffff;
              auVar117 = pmovsxbd(in_XMM9,0x7060504);
              auVar120 = pmovsxwd(in_XMM10,0x8000800080008000);
              uVar35 = 0;
              do {
                uVar129 = (undefined4)uVar35;
                auVar130._8_4_ = uVar129;
                auVar130._0_8_ = uVar35;
                auVar130._12_4_ = (int)(uVar35 >> 0x20);
                auVar138 = (auVar130 | auVar91) ^ auVar116;
                lVar32 = auVar50._0_8_;
                auVar139._0_8_ = -(ulong)(lVar32 < auVar138._0_8_);
                lVar38 = auVar50._8_8_;
                auVar139._8_8_ = -(ulong)(lVar38 < auVar138._8_8_);
                auVar138 = pshuflw(in_XMM15,auVar139,0xe8);
                in_XMM15 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                iVar136 = gap * 2 + iVar34;
                iVar137 = gap * 3 + iVar34;
                auVar138._4_4_ = open;
                auVar138._0_4_ = iVar34;
                auVar138._12_4_ = iVar137;
                auVar138._8_4_ = iVar136;
                iVar133 = iVar36 - iVar34;
                iVar135 = iVar27 - open;
                iVar136 = iVar36 - iVar136;
                iVar137 = iVar36 - iVar137;
                iVar8 = auVar120._0_4_;
                iVar9 = auVar120._4_4_;
                iVar10 = auVar120._8_4_;
                iVar11 = auVar120._12_4_;
                if ((in_XMM15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 1] =
                       (ushort)(iVar133 < iVar8) * auVar120._0_2_ |
                       (ushort)(iVar133 >= iVar8) * (short)iVar133;
                }
                auVar139 = packssdw(auVar139,auVar139);
                auVar139 = packssdw(auVar139 ^ auVar132,auVar139 ^ auVar132);
                if ((auVar139 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 2] =
                       (ushort)(iVar135 < iVar9) * auVar120._4_2_ |
                       (ushort)(iVar135 >= iVar9) * (short)iVar135;
                }
                auVar139 = (auVar130 | auVar106) ^ auVar116;
                auVar140._0_8_ = -(ulong)(lVar32 < auVar139._0_8_);
                auVar140._8_8_ = -(ulong)(lVar38 < auVar139._8_8_);
                auVar138 = packssdw(auVar138,auVar140);
                auVar138 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 3] =
                       (ushort)(iVar136 < iVar10) * auVar120._8_2_ |
                       (ushort)(iVar136 >= iVar10) * (short)iVar136;
                }
                auVar138 = pshufhw(auVar138,auVar140,0x84);
                auVar138 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 4] =
                       (ushort)(iVar137 < iVar11) * auVar120._12_2_ |
                       (ushort)(iVar137 >= iVar11) * (short)iVar137;
                }
                auVar78._4_4_ = uVar129;
                auVar78._0_4_ = uVar129;
                auVar78._8_4_ = uVar129;
                auVar78._12_4_ = uVar129;
                auVar138 = pmulld(auVar78 | auVar117,auVar70);
                iVar136 = iVar36 - auVar138._0_4_;
                iVar137 = iVar36 - auVar138._4_4_;
                iVar133 = iVar36 - auVar138._8_4_;
                iVar135 = iVar36 - auVar138._12_4_;
                auVar139 = (auVar130 | auVar92) ^ auVar116;
                auVar134._0_8_ = -(ulong)(lVar32 < auVar139._0_8_);
                auVar134._8_8_ = -(ulong)(lVar38 < auVar139._8_8_);
                auVar138 = pshuflw(auVar138,auVar134,0xe8);
                auVar138 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 5] =
                       (ushort)(iVar136 < iVar8) * auVar120._0_2_ |
                       (ushort)(iVar136 >= iVar8) * (short)iVar136;
                }
                auVar139 = packssdw(auVar134,auVar134);
                auVar138 = packssdw(auVar138,auVar139 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 6] =
                       (ushort)(iVar137 < iVar9) * auVar120._4_2_ |
                       (ushort)(iVar137 >= iVar9) * (short)iVar137;
                }
                auVar130 = (auVar130 | _DAT_00903ac0) ^ auVar116;
                auVar131._0_8_ = -(ulong)(lVar32 < auVar130._0_8_);
                auVar131._8_8_ = -(ulong)(lVar38 < auVar130._8_8_);
                auVar138 = packssdw(auVar138,auVar131);
                auVar138 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 7] =
                       (ushort)(iVar133 < iVar10) * auVar120._8_2_ |
                       (ushort)(iVar133 >= iVar10) * (short)iVar133;
                }
                auVar138 = pshufhw(auVar138,auVar131,0x84);
                auVar138 = packssdw(auVar138 ^ auVar132,auVar138 ^ auVar132);
                if ((auVar138 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_03[uVar35 + 8] =
                       (ushort)(iVar135 < iVar11) * auVar120._12_2_ |
                       (ushort)(iVar135 >= iVar11) * (short)iVar135;
                }
                uVar35 = uVar35 + 8;
                iVar27 = iVar27 + gap * -8;
                iVar34 = iVar34 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar35);
              iVar27 = (int)uVar33;
              uVar31 = iVar27 - 1;
              lVar32 = uVar33 * 0x10;
              uVar35 = 0;
              local_68 = auVar69._0_2_;
              uStack_66 = auVar69._2_2_;
              uVar90 = local_a8;
              uVar94 = uStack_a6;
              uVar96 = local_a8;
              uVar97 = uStack_a6;
              uVar99 = local_a8;
              uVar100 = uStack_a6;
              uVar102 = local_a8;
              uVar103 = uStack_a6;
              uVar76 = local_68;
              uVar53 = uStack_66;
              uVar80 = local_68;
              uVar56 = uStack_66;
              uStack_180 = local_68;
              uStack_17e = uStack_66;
              uStack_17c = local_68;
              uStack_17a = uStack_66;
              do {
                local_158 = ptr_01;
                ptr_04 = ptr_00;
                ptr_01 = b_01;
                ptr_00 = b_00;
                palVar30 = ptr;
                palVar29 = b;
                _local_188 = CONCAT22(uVar53,uVar76);
                _local_188 = CONCAT24(uVar80,_local_188);
                _local_188 = CONCAT26(uVar56,_local_188);
                b = local_108;
                ptr = local_148;
                uVar84 = palVar30[uVar31][0];
                uVar75 = palVar29[uVar31][0];
                uVar67 = ptr_00[uVar31][0];
                uVar59 = ptr_01[uVar31][0];
                auVar117._0_8_ = uVar75 << 0x10;
                auVar117._8_8_ = palVar29[uVar31][1] << 0x10 | uVar75 >> 0x30;
                auVar120._0_8_ = uVar67 << 0x10;
                auVar120._8_8_ = ptr_00[uVar31][1] << 0x10 | uVar67 >> 0x30;
                auVar121._0_8_ = uVar59 << 0x10;
                auVar121._8_8_ = ptr_01[uVar31][1] << 0x10 | uVar59 >> 0x30;
                auVar91._8_8_ = palVar30[uVar31][1] << 0x10 | uVar84 >> 0x30;
                auVar91._0_8_ = uVar84 << 0x10 | (ulong)(ushort)ptr_03[uVar35];
                lVar38 = uVar33 * (long)ppVar5->mapper[(byte)s2[uVar35]] * 0x10;
                lVar39 = 0;
                auVar116 = pmovsxbw(auVar116,0x101010101010101);
                local_198 = (undefined1  [16])0x0;
                auVar118._4_2_ = local_a8;
                auVar118._0_4_ = auVar49._0_4_;
                auVar118._6_2_ = uStack_a6;
                auVar118._8_2_ = local_a8;
                auVar118._10_2_ = uStack_a6;
                auVar118._12_2_ = local_a8;
                auVar118._14_2_ = uStack_a6;
                auVar115 = (undefined1  [16])0x0;
                do {
                  auVar70 = auVar115;
                  auVar69 = *(undefined1 (*) [16])((long)*ptr_02 + lVar39);
                  auVar92 = *(undefined1 (*) [16])((long)*b_02 + lVar39);
                  auVar106 = *(undefined1 (*) [16])((long)*b_03 + lVar39);
                  auVar50 = *(undefined1 (*) [16])((long)*b_04 + lVar39);
                  auVar91 = paddsw(auVar91,*(undefined1 (*) [16])((long)pvVar4 + lVar39 + lVar38));
                  sVar25 = auVar69._0_2_;
                  uVar53 = auVar91._0_2_;
                  uVar76 = (ushort)((short)uVar53 < sVar25) * sVar25 |
                           ((short)uVar53 >= sVar25) * uVar53;
                  sVar25 = auVar69._2_2_;
                  uVar56 = auVar91._2_2_;
                  uVar80 = (ushort)((short)uVar56 < sVar25) * sVar25 |
                           ((short)uVar56 >= sVar25) * uVar56;
                  sVar25 = auVar69._4_2_;
                  uVar95 = auVar91._4_2_;
                  uVar81 = (ushort)((short)uVar95 < sVar25) * sVar25 |
                           ((short)uVar95 >= sVar25) * uVar95;
                  sVar25 = auVar69._6_2_;
                  uVar98 = auVar91._6_2_;
                  uVar82 = (ushort)((short)uVar98 < sVar25) * sVar25 |
                           ((short)uVar98 >= sVar25) * uVar98;
                  sVar25 = auVar69._8_2_;
                  uVar101 = auVar91._8_2_;
                  uVar83 = (ushort)((short)uVar101 < sVar25) * sVar25 |
                           ((short)uVar101 >= sVar25) * uVar101;
                  sVar25 = auVar69._10_2_;
                  uVar104 = auVar91._10_2_;
                  uVar85 = (ushort)((short)uVar104 < sVar25) * sVar25 |
                           ((short)uVar104 >= sVar25) * uVar104;
                  sVar25 = auVar69._12_2_;
                  uVar87 = auVar91._12_2_;
                  uVar89 = auVar91._14_2_;
                  uVar86 = (ushort)((short)uVar87 < sVar25) * sVar25 |
                           ((short)uVar87 >= sVar25) * uVar87;
                  sVar25 = auVar69._14_2_;
                  uVar88 = (ushort)((short)uVar89 < sVar25) * sVar25 |
                           ((short)uVar89 >= sVar25) * uVar89;
                  sVar25 = auVar118._0_2_;
                  auVar71._0_2_ =
                       (ushort)((short)uVar76 < sVar25) * sVar25 |
                       ((short)uVar76 >= sVar25) * uVar76;
                  sVar44 = auVar118._2_2_;
                  auVar71._2_2_ =
                       (ushort)((short)uVar80 < sVar44) * sVar44 |
                       ((short)uVar80 >= sVar44) * uVar80;
                  sVar54 = auVar118._4_2_;
                  auVar71._4_2_ =
                       (ushort)((short)uVar81 < sVar54) * sVar54 |
                       ((short)uVar81 >= sVar54) * uVar81;
                  sVar55 = auVar118._6_2_;
                  auVar71._6_2_ =
                       (ushort)((short)uVar82 < sVar55) * sVar55 |
                       ((short)uVar82 >= sVar55) * uVar82;
                  sVar57 = auVar118._8_2_;
                  auVar71._8_2_ =
                       (ushort)((short)uVar83 < sVar57) * sVar57 |
                       ((short)uVar83 >= sVar57) * uVar83;
                  sVar58 = auVar118._10_2_;
                  auVar71._10_2_ =
                       (ushort)((short)uVar85 < sVar58) * sVar58 |
                       ((short)uVar85 >= sVar58) * uVar85;
                  sVar60 = auVar118._12_2_;
                  auVar71._12_2_ =
                       (ushort)((short)uVar86 < sVar60) * sVar60 |
                       ((short)uVar86 >= sVar60) * uVar86;
                  sVar61 = auVar118._14_2_;
                  auVar71._14_2_ =
                       (ushort)((short)uVar88 < sVar61) * sVar61 |
                       ((short)uVar88 >= sVar61) * uVar88;
                  *(undefined1 (*) [16])((long)*local_148 + lVar39) = auVar71;
                  auVar79._0_2_ = -(ushort)(sVar25 < (short)uVar76);
                  auVar79._2_2_ = -(ushort)(sVar44 < (short)uVar80);
                  auVar79._4_2_ = -(ushort)(sVar54 < (short)uVar81);
                  auVar79._6_2_ = -(ushort)(sVar55 < (short)uVar82);
                  auVar79._8_2_ = -(ushort)(sVar57 < (short)uVar83);
                  auVar79._10_2_ = -(ushort)(sVar58 < (short)uVar85);
                  auVar79._12_2_ = -(ushort)(sVar60 < (short)uVar86);
                  auVar79._14_2_ = -(ushort)(sVar61 < (short)uVar88);
                  auVar91 = pblendvb(local_198,auVar92,auVar79);
                  auVar132 = paddsw(auVar117,*(undefined1 (*) [16])((long)pvVar6 + lVar39 + lVar38))
                  ;
                  auVar64._0_2_ = -(ushort)(uVar53 == auVar71._0_2_);
                  auVar64._2_2_ = -(ushort)(uVar56 == auVar71._2_2_);
                  auVar64._4_2_ = -(ushort)(uVar95 == auVar71._4_2_);
                  auVar64._6_2_ = -(ushort)(uVar98 == auVar71._6_2_);
                  auVar64._8_2_ = -(ushort)(uVar101 == auVar71._8_2_);
                  auVar64._10_2_ = -(ushort)(uVar104 == auVar71._10_2_);
                  auVar64._12_2_ = -(ushort)(uVar87 == auVar71._12_2_);
                  auVar64._14_2_ = -(ushort)(uVar89 == auVar71._14_2_);
                  auVar132 = pblendvb(auVar91,auVar132,auVar64);
                  *(undefined1 (*) [16])((long)*local_108 + lVar39) = auVar132;
                  auVar117 = pblendvb(auVar70,auVar106,auVar79);
                  auVar91 = paddsw(auVar120,*(undefined1 (*) [16])((long)pvVar7 + lVar39 + lVar38));
                  auVar120 = pblendvb(auVar117,auVar91,auVar64);
                  *(undefined1 (*) [16])((long)*ptr_04 + lVar39) = auVar120;
                  auVar117 = pblendvb(auVar116,auVar50,auVar79);
                  auVar91 = pmovsxbw(auVar79,0x101010101010101);
                  auVar91 = paddsw(auVar121,auVar91);
                  auVar117 = pblendvb(auVar117,auVar91,auVar64);
                  *(undefined1 (*) [16])((long)*local_158 + lVar39) = auVar117;
                  uVar76 = ((short)auVar71._0_2_ < (short)local_188) * auVar71._0_2_ |
                           ((short)auVar71._0_2_ >= (short)local_188) * local_188;
                  uVar53 = ((short)auVar71._2_2_ < (short)uStack_186) * auVar71._2_2_ |
                           ((short)auVar71._2_2_ >= (short)uStack_186) * uStack_186;
                  uVar80 = ((short)auVar71._4_2_ < (short)uStack_184) * auVar71._4_2_ |
                           ((short)auVar71._4_2_ >= (short)uStack_184) * uStack_184;
                  uVar56 = ((short)auVar71._6_2_ < (short)uStack_182) * auVar71._6_2_ |
                           ((short)auVar71._6_2_ >= (short)uStack_182) * uStack_182;
                  uStack_180 = ((short)auVar71._8_2_ < (short)uStack_180) * auVar71._8_2_ |
                               ((short)auVar71._8_2_ >= (short)uStack_180) * uStack_180;
                  uStack_17e = ((short)auVar71._10_2_ < (short)uStack_17e) * auVar71._10_2_ |
                               ((short)auVar71._10_2_ >= (short)uStack_17e) * uStack_17e;
                  uStack_17c = ((short)auVar71._12_2_ < (short)uStack_17c) * auVar71._12_2_ |
                               ((short)auVar71._12_2_ >= (short)uStack_17c) * uStack_17c;
                  uStack_17a = ((short)auVar71._14_2_ < (short)uStack_17a) * auVar71._14_2_ |
                               ((short)auVar71._14_2_ >= (short)uStack_17a) * uStack_17a;
                  _local_188 = CONCAT22(uVar53,uVar76);
                  _local_188 = CONCAT24(uVar80,_local_188);
                  _local_188 = CONCAT26(uVar56,_local_188);
                  uVar90 = ((short)uVar90 < (short)auVar71._0_2_) * auVar71._0_2_ |
                           ((short)uVar90 >= (short)auVar71._0_2_) * uVar90;
                  uVar94 = ((short)uVar94 < (short)auVar71._2_2_) * auVar71._2_2_ |
                           ((short)uVar94 >= (short)auVar71._2_2_) * uVar94;
                  uVar96 = ((short)uVar96 < (short)auVar71._4_2_) * auVar71._4_2_ |
                           ((short)uVar96 >= (short)auVar71._4_2_) * uVar96;
                  uVar97 = ((short)uVar97 < (short)auVar71._6_2_) * auVar71._6_2_ |
                           ((short)uVar97 >= (short)auVar71._6_2_) * uVar97;
                  uVar99 = ((short)uVar99 < (short)auVar71._8_2_) * auVar71._8_2_ |
                           ((short)uVar99 >= (short)auVar71._8_2_) * uVar99;
                  uVar100 = ((short)uVar100 < (short)auVar71._10_2_) * auVar71._10_2_ |
                            ((short)uVar100 >= (short)auVar71._10_2_) * uVar100;
                  uVar102 = ((short)uVar102 < (short)auVar71._12_2_) * auVar71._12_2_ |
                            ((short)uVar102 >= (short)auVar71._12_2_) * uVar102;
                  uVar103 = ((short)uVar103 < (short)auVar71._14_2_) * auVar71._14_2_ |
                            ((short)uVar103 >= (short)auVar71._14_2_) * uVar103;
                  sVar25 = auVar117._0_2_;
                  sVar44 = auVar120._0_2_;
                  uVar81 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._2_2_;
                  sVar44 = auVar120._2_2_;
                  uVar95 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._4_2_;
                  sVar44 = auVar120._4_2_;
                  uVar82 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._6_2_;
                  sVar44 = auVar120._6_2_;
                  uVar98 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._8_2_;
                  sVar44 = auVar120._8_2_;
                  uVar83 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._10_2_;
                  sVar44 = auVar120._10_2_;
                  uVar101 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44
                  ;
                  sVar25 = auVar117._12_2_;
                  sVar44 = auVar120._12_2_;
                  sVar54 = auVar120._14_2_;
                  uVar85 = (ushort)(sVar44 < sVar25) * sVar25 | (ushort)(sVar44 >= sVar25) * sVar44;
                  sVar25 = auVar117._14_2_;
                  uVar104 = (ushort)(sVar54 < sVar25) * sVar25 | (ushort)(sVar54 >= sVar25) * sVar54
                  ;
                  auVar23._4_4_ = uVar45;
                  auVar23._0_4_ = uVar45;
                  auVar23._8_4_ = uVar45;
                  auVar23._12_4_ = uVar45;
                  auVar91 = psubsw(auVar71,auVar23);
                  auVar21._4_4_ = uVar46;
                  auVar21._0_4_ = uVar46;
                  auVar21._8_4_ = uVar46;
                  auVar21._12_4_ = uVar46;
                  auVar69 = psubsw(auVar69,auVar21);
                  sVar44 = auVar91._0_2_;
                  sVar105 = auVar69._0_2_;
                  auVar51._0_2_ = -(ushort)(sVar105 < sVar44);
                  sVar54 = auVar91._2_2_;
                  sVar108 = auVar69._2_2_;
                  auVar51._2_2_ = -(ushort)(sVar108 < sVar54);
                  sVar55 = auVar91._4_2_;
                  sVar109 = auVar69._4_2_;
                  auVar51._4_2_ = -(ushort)(sVar109 < sVar55);
                  sVar57 = auVar91._6_2_;
                  sVar110 = auVar69._6_2_;
                  auVar51._6_2_ = -(ushort)(sVar110 < sVar57);
                  sVar58 = auVar91._8_2_;
                  sVar111 = auVar69._8_2_;
                  auVar51._8_2_ = -(ushort)(sVar111 < sVar58);
                  sVar60 = auVar91._10_2_;
                  sVar112 = auVar69._10_2_;
                  auVar51._10_2_ = -(ushort)(sVar112 < sVar60);
                  sVar61 = auVar91._12_2_;
                  sVar113 = auVar69._12_2_;
                  sVar62 = auVar91._14_2_;
                  auVar51._12_2_ = -(ushort)(sVar113 < sVar61);
                  sVar114 = auVar69._14_2_;
                  auVar51._14_2_ = -(ushort)(sVar114 < sVar62);
                  auVar91 = pblendvb(auVar92,auVar132,auVar51);
                  auVar138 = pblendvb(auVar106,auVar120,auVar51);
                  auVar92 = pmovsxbw(auVar69,0x101010101010101);
                  auVar50 = paddsw(auVar50,auVar92);
                  auVar106 = paddsw(auVar117,auVar92);
                  auVar50 = pblendvb(auVar50,auVar106,auVar51);
                  auVar92 = psubsw(auVar118,auVar21);
                  sVar119 = auVar92._0_2_;
                  auVar72._0_2_ = -(ushort)(sVar119 < sVar44);
                  sVar122 = auVar92._2_2_;
                  auVar72._2_2_ = -(ushort)(sVar122 < sVar54);
                  sVar123 = auVar92._4_2_;
                  auVar72._4_2_ = -(ushort)(sVar123 < sVar55);
                  sVar124 = auVar92._6_2_;
                  auVar72._6_2_ = -(ushort)(sVar124 < sVar57);
                  sVar125 = auVar92._8_2_;
                  auVar72._8_2_ = -(ushort)(sVar125 < sVar58);
                  sVar126 = auVar92._10_2_;
                  auVar72._10_2_ = -(ushort)(sVar126 < sVar60);
                  sVar127 = auVar92._12_2_;
                  auVar72._12_2_ = -(ushort)(sVar127 < sVar61);
                  sVar128 = auVar92._14_2_;
                  auVar72._14_2_ = -(ushort)(sVar128 < sVar62);
                  local_198 = pblendvb(local_198,auVar132,auVar72);
                  sVar25 = auVar132._0_2_;
                  uVar90 = (ushort)((short)uVar90 < sVar25) * sVar25 |
                           ((short)uVar90 >= sVar25) * uVar90;
                  sVar25 = auVar132._2_2_;
                  uVar94 = (ushort)((short)uVar94 < sVar25) * sVar25 |
                           ((short)uVar94 >= sVar25) * uVar94;
                  sVar25 = auVar132._4_2_;
                  uVar96 = (ushort)((short)uVar96 < sVar25) * sVar25 |
                           ((short)uVar96 >= sVar25) * uVar96;
                  sVar25 = auVar132._6_2_;
                  uVar97 = (ushort)((short)uVar97 < sVar25) * sVar25 |
                           ((short)uVar97 >= sVar25) * uVar97;
                  sVar25 = auVar132._8_2_;
                  uVar99 = (ushort)((short)uVar99 < sVar25) * sVar25 |
                           ((short)uVar99 >= sVar25) * uVar99;
                  sVar25 = auVar132._10_2_;
                  uVar100 = (ushort)((short)uVar100 < sVar25) * sVar25 |
                            ((short)uVar100 >= sVar25) * uVar100;
                  sVar25 = auVar132._12_2_;
                  uVar102 = (ushort)((short)uVar102 < sVar25) * sVar25 |
                            ((short)uVar102 >= sVar25) * uVar102;
                  sVar25 = auVar132._14_2_;
                  uVar103 = (ushort)((short)uVar103 < sVar25) * sVar25 |
                            ((short)uVar103 >= sVar25) * uVar103;
                  uVar90 = ((short)uVar81 < (short)uVar90) * uVar90 |
                           ((short)uVar81 >= (short)uVar90) * uVar81;
                  uVar94 = ((short)uVar95 < (short)uVar94) * uVar94 |
                           ((short)uVar95 >= (short)uVar94) * uVar95;
                  uVar96 = ((short)uVar82 < (short)uVar96) * uVar96 |
                           ((short)uVar82 >= (short)uVar96) * uVar82;
                  uVar97 = ((short)uVar98 < (short)uVar97) * uVar97 |
                           ((short)uVar98 >= (short)uVar97) * uVar98;
                  uVar99 = ((short)uVar83 < (short)uVar99) * uVar99 |
                           ((short)uVar83 >= (short)uVar99) * uVar83;
                  uVar100 = ((short)uVar101 < (short)uVar100) * uVar100 |
                            ((short)uVar101 >= (short)uVar100) * uVar101;
                  uVar102 = ((short)uVar85 < (short)uVar102) * uVar102 |
                            ((short)uVar85 >= (short)uVar102) * uVar85;
                  uVar103 = ((short)uVar104 < (short)uVar103) * uVar103 |
                            ((short)uVar104 >= (short)uVar103) * uVar104;
                  puVar1 = (ushort *)((long)*ptr_02 + lVar39);
                  *puVar1 = (ushort)(sVar44 < sVar105) * sVar105 |
                            (ushort)(sVar44 >= sVar105) * sVar44;
                  puVar1[1] = (ushort)(sVar54 < sVar108) * sVar108 |
                              (ushort)(sVar54 >= sVar108) * sVar54;
                  puVar1[2] = (ushort)(sVar55 < sVar109) * sVar109 |
                              (ushort)(sVar55 >= sVar109) * sVar55;
                  puVar1[3] = (ushort)(sVar57 < sVar110) * sVar110 |
                              (ushort)(sVar57 >= sVar110) * sVar57;
                  puVar1[4] = (ushort)(sVar58 < sVar111) * sVar111 |
                              (ushort)(sVar58 >= sVar111) * sVar58;
                  puVar1[5] = (ushort)(sVar60 < sVar112) * sVar112 |
                              (ushort)(sVar60 >= sVar112) * sVar60;
                  puVar1[6] = (ushort)(sVar61 < sVar113) * sVar113 |
                              (ushort)(sVar61 >= sVar113) * sVar61;
                  puVar1[7] = (ushort)(sVar62 < sVar114) * sVar114 |
                              (ushort)(sVar62 >= sVar114) * sVar62;
                  *(undefined1 (*) [16])((long)*b_02 + lVar39) = auVar91;
                  *(undefined1 (*) [16])((long)*b_03 + lVar39) = auVar138;
                  *(undefined1 (*) [16])((long)*b_04 + lVar39) = auVar50;
                  auVar118._0_2_ =
                       (ushort)(sVar44 < sVar119) * sVar119 | (ushort)(sVar44 >= sVar119) * sVar44;
                  auVar118._2_2_ =
                       (ushort)(sVar54 < sVar122) * sVar122 | (ushort)(sVar54 >= sVar122) * sVar54;
                  auVar118._4_2_ =
                       (ushort)(sVar55 < sVar123) * sVar123 | (ushort)(sVar55 >= sVar123) * sVar55;
                  auVar118._6_2_ =
                       (ushort)(sVar57 < sVar124) * sVar124 | (ushort)(sVar57 >= sVar124) * sVar57;
                  auVar118._8_2_ =
                       (ushort)(sVar58 < sVar125) * sVar125 | (ushort)(sVar58 >= sVar125) * sVar58;
                  auVar118._10_2_ =
                       (ushort)(sVar60 < sVar126) * sVar126 | (ushort)(sVar60 >= sVar126) * sVar60;
                  auVar118._12_2_ =
                       (ushort)(sVar61 < sVar127) * sVar127 | (ushort)(sVar61 >= sVar127) * sVar61;
                  auVar118._14_2_ =
                       (ushort)(sVar62 < sVar128) * sVar128 | (ushort)(sVar62 >= sVar128) * sVar62;
                  auVar115 = pblendvb(auVar70,auVar120,auVar72);
                  auVar92 = paddsw(auVar116,_DAT_00904d10);
                  auVar116 = pblendvb(auVar92,auVar106,auVar72);
                  auVar91 = *(undefined1 (*) [16])((long)*palVar30 + lVar39);
                  auVar117 = *(undefined1 (*) [16])((long)*palVar29 + lVar39);
                  auVar120 = *(undefined1 (*) [16])((long)*ptr_00 + lVar39);
                  auVar121 = *(undefined1 (*) [16])((long)*ptr_01 + lVar39);
                  lVar39 = lVar39 + 0x10;
                } while (lVar32 != lVar39);
                uStack_100 = auVar69._8_8_;
                local_108 = palVar29;
                uStack_140 = auVar70._8_8_;
                local_148 = palVar30;
                iVar34 = 0;
                auVar24._4_4_ = uVar45;
                auVar24._0_4_ = uVar45;
                auVar24._8_4_ = uVar45;
                auVar24._12_4_ = uVar45;
                auVar22._4_4_ = uVar46;
                auVar22._0_4_ = uVar46;
                auVar22._8_4_ = uVar46;
                auVar22._12_4_ = uVar46;
                auVar69 = pmovsxbw(auVar120,0x101010101010101);
                do {
                  uVar12 = ptr_03[uVar35 + 1] - open;
                  if (ptr_03[uVar35 + 1] - open < -0x7fff) {
                    uVar12 = 0xffff8000;
                  }
                  uVar84 = palVar30[uVar31][0];
                  auVar73._8_8_ = palVar30[uVar31][1] << 0x10 | uVar84 >> 0x30;
                  auVar73._0_8_ = uVar84 << 0x10 | (ulong)(ushort)ptr_03[uVar35];
                  uVar84 = auVar118._0_8_;
                  auVar118._8_8_ = auVar118._8_8_ << 0x10 | uVar84 >> 0x30;
                  auVar118._0_8_ = uVar84 << 0x10 | (ulong)uVar12 & 0xffff;
                  uVar84 = auVar116._0_8_;
                  auVar116._8_8_ = auVar116._8_8_ << 0x10 | uVar84 >> 0x30;
                  auVar116._0_8_ = uVar84 << 0x10 | 1;
                  lVar39 = local_198._8_8_;
                  uVar84 = local_198._0_8_;
                  local_198._0_8_ = uVar84 << 0x10;
                  local_198._8_8_ = lVar39 << 0x10 | uVar84 >> 0x30;
                  lVar39 = auVar115._8_8_;
                  uVar84 = auVar115._0_8_;
                  auVar115._0_8_ = uVar84 << 0x10;
                  auVar115._8_8_ = lVar39 << 0x10 | uVar84 >> 0x30;
                  lVar39 = 0;
                  do {
                    auVar92 = paddsw(auVar73,*(undefined1 (*) [16])((long)pvVar4 + lVar39 + lVar38))
                    ;
                    psVar2 = (short *)((long)*ptr + lVar39);
                    sVar62 = *psVar2;
                    sVar105 = psVar2[1];
                    sVar108 = psVar2[2];
                    sVar109 = psVar2[3];
                    sVar110 = psVar2[4];
                    sVar111 = psVar2[5];
                    sVar112 = psVar2[6];
                    sVar113 = psVar2[7];
                    sVar25 = auVar118._0_2_;
                    auVar65._0_2_ =
                         (ushort)(sVar62 < sVar25) * sVar25 | (ushort)(sVar62 >= sVar25) * sVar62;
                    sVar44 = auVar118._2_2_;
                    auVar65._2_2_ =
                         (ushort)(sVar105 < sVar44) * sVar44 | (ushort)(sVar105 >= sVar44) * sVar105
                    ;
                    sVar54 = auVar118._4_2_;
                    auVar65._4_2_ =
                         (ushort)(sVar108 < sVar54) * sVar54 | (ushort)(sVar108 >= sVar54) * sVar108
                    ;
                    sVar55 = auVar118._6_2_;
                    auVar65._6_2_ =
                         (ushort)(sVar109 < sVar55) * sVar55 | (ushort)(sVar109 >= sVar55) * sVar109
                    ;
                    sVar57 = auVar118._8_2_;
                    auVar65._8_2_ =
                         (ushort)(sVar110 < sVar57) * sVar57 | (ushort)(sVar110 >= sVar57) * sVar110
                    ;
                    sVar58 = auVar118._10_2_;
                    auVar65._10_2_ =
                         (ushort)(sVar111 < sVar58) * sVar58 | (ushort)(sVar111 >= sVar58) * sVar111
                    ;
                    sVar60 = auVar118._12_2_;
                    auVar65._12_2_ =
                         (ushort)(sVar112 < sVar60) * sVar60 | (ushort)(sVar112 >= sVar60) * sVar112
                    ;
                    sVar61 = auVar118._14_2_;
                    auVar65._14_2_ =
                         (ushort)(sVar113 < sVar61) * sVar61 | (ushort)(sVar113 >= sVar61) * sVar113
                    ;
                    *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar65;
                    auVar74._0_2_ = -(ushort)(auVar92._0_2_ == auVar65._0_2_);
                    auVar74._2_2_ = -(ushort)(auVar92._2_2_ == auVar65._2_2_);
                    auVar74._4_2_ = -(ushort)(auVar92._4_2_ == auVar65._4_2_);
                    auVar74._6_2_ = -(ushort)(auVar92._6_2_ == auVar65._6_2_);
                    auVar74._8_2_ = -(ushort)(auVar92._8_2_ == auVar65._8_2_);
                    auVar74._10_2_ = -(ushort)(auVar92._10_2_ == auVar65._10_2_);
                    auVar74._12_2_ = -(ushort)(auVar92._12_2_ == auVar65._12_2_);
                    auVar74._14_2_ = -(ushort)(auVar92._14_2_ == auVar65._14_2_);
                    auVar52._0_2_ = -(ushort)(sVar25 < sVar62);
                    auVar52._2_2_ = -(ushort)(sVar44 < sVar105);
                    auVar52._4_2_ = -(ushort)(sVar54 < sVar108);
                    auVar52._6_2_ = -(ushort)(sVar55 < sVar109);
                    auVar52._8_2_ = -(ushort)(sVar57 < sVar110);
                    auVar52._10_2_ = -(ushort)(sVar58 < sVar111);
                    auVar52._12_2_ = -(ushort)(sVar60 < sVar112);
                    auVar52._14_2_ = -(ushort)(sVar61 < sVar113);
                    auVar52 = auVar52 | auVar74;
                    auVar106 = pblendvb(local_198,*(undefined1 (*) [16])((long)*b + lVar39),auVar52)
                    ;
                    *(undefined1 (*) [16])((long)*b + lVar39) = auVar106;
                    auVar50 = pblendvb(auVar115,*(undefined1 (*) [16])((long)*ptr_04 + lVar39),
                                       auVar52);
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar39) = auVar50;
                    auVar91 = pblendvb(auVar116,*(undefined1 (*) [16])((long)*local_158 + lVar39),
                                       auVar52);
                    *(undefined1 (*) [16])((long)*local_158 + lVar39) = auVar91;
                    uVar76 = ((short)auVar65._0_2_ < (short)uVar76) * auVar65._0_2_ |
                             ((short)auVar65._0_2_ >= (short)uVar76) * uVar76;
                    uVar53 = ((short)auVar65._2_2_ < (short)uVar53) * auVar65._2_2_ |
                             ((short)auVar65._2_2_ >= (short)uVar53) * uVar53;
                    uVar80 = ((short)auVar65._4_2_ < (short)uVar80) * auVar65._4_2_ |
                             ((short)auVar65._4_2_ >= (short)uVar80) * uVar80;
                    uVar56 = ((short)auVar65._6_2_ < (short)uVar56) * auVar65._6_2_ |
                             ((short)auVar65._6_2_ >= (short)uVar56) * uVar56;
                    uStack_180 = ((short)auVar65._8_2_ < (short)uStack_180) * auVar65._8_2_ |
                                 ((short)auVar65._8_2_ >= (short)uStack_180) * uStack_180;
                    uStack_17e = ((short)auVar65._10_2_ < (short)uStack_17e) * auVar65._10_2_ |
                                 ((short)auVar65._10_2_ >= (short)uStack_17e) * uStack_17e;
                    uStack_17c = ((short)auVar65._12_2_ < (short)uStack_17c) * auVar65._12_2_ |
                                 ((short)auVar65._12_2_ >= (short)uStack_17c) * uStack_17c;
                    uStack_17a = ((short)auVar65._14_2_ < (short)uStack_17a) * auVar65._14_2_ |
                                 ((short)auVar65._14_2_ >= (short)uStack_17a) * uStack_17a;
                    uVar90 = ((short)uVar90 < (short)auVar65._0_2_) * auVar65._0_2_ |
                             ((short)uVar90 >= (short)auVar65._0_2_) * uVar90;
                    uVar94 = ((short)uVar94 < (short)auVar65._2_2_) * auVar65._2_2_ |
                             ((short)uVar94 >= (short)auVar65._2_2_) * uVar94;
                    uVar96 = ((short)uVar96 < (short)auVar65._4_2_) * auVar65._4_2_ |
                             ((short)uVar96 >= (short)auVar65._4_2_) * uVar96;
                    uVar97 = ((short)uVar97 < (short)auVar65._6_2_) * auVar65._6_2_ |
                             ((short)uVar97 >= (short)auVar65._6_2_) * uVar97;
                    uVar99 = ((short)uVar99 < (short)auVar65._8_2_) * auVar65._8_2_ |
                             ((short)uVar99 >= (short)auVar65._8_2_) * uVar99;
                    uVar100 = ((short)uVar100 < (short)auVar65._10_2_) * auVar65._10_2_ |
                              ((short)uVar100 >= (short)auVar65._10_2_) * uVar100;
                    uVar102 = ((short)uVar102 < (short)auVar65._12_2_) * auVar65._12_2_ |
                              ((short)uVar102 >= (short)auVar65._12_2_) * uVar102;
                    uVar103 = ((short)uVar103 < (short)auVar65._14_2_) * auVar65._14_2_ |
                              ((short)uVar103 >= (short)auVar65._14_2_) * uVar103;
                    sVar25 = auVar106._0_2_;
                    uVar90 = (ushort)((short)uVar90 < sVar25) * sVar25 |
                             ((short)uVar90 >= sVar25) * uVar90;
                    sVar25 = auVar106._2_2_;
                    uVar94 = (ushort)((short)uVar94 < sVar25) * sVar25 |
                             ((short)uVar94 >= sVar25) * uVar94;
                    sVar25 = auVar106._4_2_;
                    uVar96 = (ushort)((short)uVar96 < sVar25) * sVar25 |
                             ((short)uVar96 >= sVar25) * uVar96;
                    sVar25 = auVar106._6_2_;
                    uVar97 = (ushort)((short)uVar97 < sVar25) * sVar25 |
                             ((short)uVar97 >= sVar25) * uVar97;
                    sVar25 = auVar106._8_2_;
                    uVar99 = (ushort)((short)uVar99 < sVar25) * sVar25 |
                             ((short)uVar99 >= sVar25) * uVar99;
                    sVar25 = auVar106._10_2_;
                    uVar100 = (ushort)((short)uVar100 < sVar25) * sVar25 |
                              ((short)uVar100 >= sVar25) * uVar100;
                    sVar25 = auVar106._12_2_;
                    uVar102 = (ushort)((short)uVar102 < sVar25) * sVar25 |
                              ((short)uVar102 >= sVar25) * uVar102;
                    sVar25 = auVar106._14_2_;
                    uVar103 = (ushort)((short)uVar103 < sVar25) * sVar25 |
                              ((short)uVar103 >= sVar25) * uVar103;
                    sVar25 = auVar91._0_2_;
                    sVar44 = auVar50._0_2_;
                    uVar81 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._2_2_;
                    sVar44 = auVar50._2_2_;
                    uVar95 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._4_2_;
                    sVar44 = auVar50._4_2_;
                    uVar82 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._6_2_;
                    sVar44 = auVar50._6_2_;
                    uVar98 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._8_2_;
                    sVar44 = auVar50._8_2_;
                    uVar83 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._10_2_;
                    sVar44 = auVar50._10_2_;
                    uVar101 = (ushort)(sVar44 < sVar25) * sVar25 |
                              (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._12_2_;
                    sVar44 = auVar50._12_2_;
                    sVar54 = auVar50._14_2_;
                    uVar85 = (ushort)(sVar44 < sVar25) * sVar25 |
                             (ushort)(sVar44 >= sVar25) * sVar44;
                    sVar25 = auVar91._14_2_;
                    uVar104 = (ushort)(sVar54 < sVar25) * sVar25 |
                              (ushort)(sVar54 >= sVar25) * sVar54;
                    uVar90 = ((short)uVar81 < (short)uVar90) * uVar90 |
                             ((short)uVar81 >= (short)uVar90) * uVar81;
                    uVar94 = ((short)uVar95 < (short)uVar94) * uVar94 |
                             ((short)uVar95 >= (short)uVar94) * uVar95;
                    uVar96 = ((short)uVar82 < (short)uVar96) * uVar96 |
                             ((short)uVar82 >= (short)uVar96) * uVar82;
                    uVar97 = ((short)uVar98 < (short)uVar97) * uVar97 |
                             ((short)uVar98 >= (short)uVar97) * uVar98;
                    uVar99 = ((short)uVar83 < (short)uVar99) * uVar99 |
                             ((short)uVar83 >= (short)uVar99) * uVar83;
                    uVar100 = ((short)uVar101 < (short)uVar100) * uVar100 |
                              ((short)uVar101 >= (short)uVar100) * uVar101;
                    uVar102 = ((short)uVar85 < (short)uVar102) * uVar102 |
                              ((short)uVar85 >= (short)uVar102) * uVar85;
                    uVar103 = ((short)uVar104 < (short)uVar103) * uVar103 |
                              ((short)uVar104 >= (short)uVar103) * uVar104;
                    auVar92 = psubsw(auVar65,auVar24);
                    auVar118 = psubsw(auVar118,auVar22);
                    auVar66._0_2_ = -(ushort)(auVar118._0_2_ < auVar92._0_2_);
                    auVar66._2_2_ = -(ushort)(auVar118._2_2_ < auVar92._2_2_);
                    auVar66._4_2_ = -(ushort)(auVar118._4_2_ < auVar92._4_2_);
                    auVar66._6_2_ = -(ushort)(auVar118._6_2_ < auVar92._6_2_);
                    auVar66._8_2_ = -(ushort)(auVar118._8_2_ < auVar92._8_2_);
                    auVar66._10_2_ = -(ushort)(auVar118._10_2_ < auVar92._10_2_);
                    auVar66._12_2_ = -(ushort)(auVar118._12_2_ < auVar92._12_2_);
                    auVar66._14_2_ = -(ushort)(auVar118._14_2_ < auVar92._14_2_);
                    if ((ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(auVar66._14_2_ >> 7) & 1) << 0xe |
                                auVar66._14_2_ & 0x8000) == 0xffff) goto LAB_0073e298;
                    local_198 = pblendvb(local_198,auVar106,auVar66);
                    auVar115 = pblendvb(auVar115,auVar50,auVar66);
                    auVar106 = paddsw(auVar116,auVar69);
                    auVar92 = paddsw(auVar91,auVar69);
                    auVar116 = pblendvb(auVar106,auVar92,auVar66);
                    auVar73 = *(undefined1 (*) [16])((long)*palVar30 + lVar39);
                    lVar39 = lVar39 + 0x10;
                  } while (lVar32 != lVar39);
                  iVar34 = iVar34 + 1;
                } while (iVar34 != 8);
LAB_0073e298:
                uVar84 = ptr[uVar48][1];
                uVar75 = b[uVar48][1];
                uVar67 = ptr_04[uVar48][1];
                uVar59 = local_158[uVar48][1];
                if (iVar26 < 7) {
                  iVar34 = 0;
                  uVar77 = ptr[uVar48][0];
                  uVar68 = b[uVar48][0];
                  uVar63 = ptr_04[uVar48][0];
                  uVar47 = local_158[uVar48][0];
                  do {
                    uVar84 = uVar84 << 0x10 | uVar77 >> 0x30;
                    uVar75 = uVar75 << 0x10 | uVar68 >> 0x30;
                    uVar67 = uVar67 << 0x10 | uVar63 >> 0x30;
                    uVar59 = uVar59 << 0x10 | uVar47 >> 0x30;
                    iVar34 = iVar34 + 1;
                    uVar77 = uVar77 << 0x10;
                    uVar68 = uVar68 << 0x10;
                    uVar63 = uVar63 << 0x10;
                    uVar47 = uVar47 << 0x10;
                  } while (iVar34 < 7 - iVar26);
                }
                *(int *)(*((ppVar28->field_4).trace)->trace_del_table + uVar35 * 4) =
                     (int)(short)(uVar84 >> 0x30);
                *(int *)(*(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 8) +
                        uVar35 * 4) = (int)(short)(uVar75 >> 0x30);
                *(int *)(*(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x10) +
                        uVar35 * 4) = (int)(short)(uVar67 >> 0x30);
                *(int *)(*(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x18) +
                        uVar35 * 4) = (int)(short)(uVar59 >> 0x30);
                uVar35 = uVar35 + 1;
                b_00 = ptr_04;
                b_01 = local_158;
                if (uVar35 == (uint)s2Len) {
                  uVar35 = (ulong)(uint)(iVar27 * 4);
                  lVar38 = uVar33 * 8;
                  lVar39 = (ulong)(uint)(iVar27 * 4) * 3;
                  lVar42 = (ulong)(uint)(iVar27 * 4) * 5;
                  lVar13 = uVar33 * 0x18;
                  lVar14 = uVar33 * 0x1c;
                  uVar33 = 0;
                  do {
                    psVar2 = (short *)((long)*ptr + uVar33 * 4);
                    sVar25 = psVar2[1];
                    sVar44 = psVar2[2];
                    sVar54 = psVar2[3];
                    sVar55 = psVar2[4];
                    sVar57 = psVar2[5];
                    sVar58 = psVar2[6];
                    sVar60 = psVar2[7];
                    psVar3 = (short *)((long)*b + uVar33 * 4);
                    sVar61 = *psVar3;
                    sVar62 = psVar3[1];
                    sVar105 = psVar3[2];
                    sVar108 = psVar3[3];
                    sVar109 = psVar3[4];
                    sVar110 = psVar3[5];
                    sVar111 = psVar3[6];
                    sVar112 = psVar3[7];
                    psVar3 = (short *)((long)*ptr_04 + uVar33 * 4);
                    sVar113 = *psVar3;
                    sVar114 = psVar3[1];
                    sVar119 = psVar3[2];
                    sVar122 = psVar3[3];
                    sVar123 = psVar3[4];
                    sVar124 = psVar3[5];
                    sVar125 = psVar3[6];
                    sVar126 = psVar3[7];
                    psVar3 = (short *)((long)*local_158 + uVar33 * 4);
                    sVar127 = *psVar3;
                    sVar128 = psVar3[1];
                    sVar15 = psVar3[2];
                    sVar16 = psVar3[3];
                    sVar17 = psVar3[4];
                    sVar18 = psVar3[5];
                    sVar19 = psVar3[6];
                    sVar20 = psVar3[7];
                    lVar40 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x20);
                    *(int *)(lVar40 + uVar33) = (int)*psVar2;
                    lVar40 = lVar40 + uVar33;
                    *(int *)(uVar35 + lVar40) = (int)sVar25;
                    *(int *)(lVar38 + lVar40) = (int)sVar44;
                    *(int *)(lVar39 + lVar40) = (int)sVar54;
                    *(int *)(lVar32 + lVar40) = (int)sVar55;
                    *(int *)(lVar42 + lVar40) = (int)sVar57;
                    *(int *)(lVar13 + lVar40) = (int)sVar58;
                    *(int *)(lVar14 + lVar40) = (int)sVar60;
                    lVar40 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x28);
                    *(int *)(lVar40 + uVar33) = (int)sVar61;
                    lVar40 = lVar40 + uVar33;
                    *(int *)(uVar35 + lVar40) = (int)sVar62;
                    *(int *)(lVar38 + lVar40) = (int)sVar105;
                    *(int *)(lVar39 + lVar40) = (int)sVar108;
                    *(int *)(lVar32 + lVar40) = (int)sVar109;
                    *(int *)(lVar42 + lVar40) = (int)sVar110;
                    *(int *)(lVar13 + lVar40) = (int)sVar111;
                    *(int *)(lVar14 + lVar40) = (int)sVar112;
                    lVar40 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x30);
                    *(int *)(lVar40 + uVar33) = (int)sVar113;
                    lVar40 = lVar40 + uVar33;
                    *(int *)(uVar35 + lVar40) = (int)sVar114;
                    *(int *)(lVar38 + lVar40) = (int)sVar119;
                    *(int *)(lVar39 + lVar40) = (int)sVar122;
                    *(int *)(lVar32 + lVar40) = (int)sVar123;
                    *(int *)(lVar42 + lVar40) = (int)sVar124;
                    *(int *)(lVar13 + lVar40) = (int)sVar125;
                    *(int *)(lVar14 + lVar40) = (int)sVar126;
                    lVar40 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x38);
                    *(int *)(lVar40 + uVar33) = (int)sVar127;
                    lVar40 = lVar40 + uVar33;
                    *(int *)(uVar35 + lVar40) = (int)sVar128;
                    *(int *)(lVar38 + lVar40) = (int)sVar15;
                    *(int *)(lVar39 + lVar40) = (int)sVar16;
                    *(int *)(lVar32 + lVar40) = (int)sVar17;
                    *(int *)(lVar42 + lVar40) = (int)sVar18;
                    *(int *)(lVar13 + lVar40) = (int)sVar19;
                    *(int *)(lVar14 + lVar40) = (int)sVar20;
                    uVar33 = uVar33 + 4;
                  } while (uVar35 != uVar33);
                  uVar33 = ptr[uVar48][1];
                  uVar35 = b[uVar48][1];
                  uVar84 = ptr_04[uVar48][1];
                  uVar75 = local_158[uVar48][1];
                  if (iVar26 < 7) {
                    iVar27 = 0;
                    uVar67 = ptr[uVar48][0];
                    uVar59 = b[uVar48][0];
                    uVar77 = ptr_04[uVar48][0];
                    uVar48 = local_158[uVar48][0];
                    do {
                      uVar33 = uVar33 << 0x10 | uVar67 >> 0x30;
                      uVar35 = uVar35 << 0x10 | uVar59 >> 0x30;
                      uVar84 = uVar84 << 0x10 | uVar77 >> 0x30;
                      uVar75 = uVar75 << 0x10 | uVar48 >> 0x30;
                      iVar27 = iVar27 + 1;
                      uVar67 = uVar67 << 0x10;
                      uVar59 = uVar59 << 0x10;
                      uVar77 = uVar77 << 0x10;
                      uVar48 = uVar48 << 0x10;
                    } while (iVar27 < 7 - iVar26);
                  }
                  auVar107._0_2_ = -(ushort)((short)uVar76 < (short)local_a8);
                  auVar107._2_2_ = -(ushort)((short)uVar53 < (short)uStack_a6);
                  auVar107._4_2_ = -(ushort)((short)uVar80 < (short)local_a8);
                  auVar107._6_2_ = -(ushort)((short)uVar56 < (short)uStack_a6);
                  auVar107._8_2_ = -(ushort)((short)uStack_180 < (short)local_a8);
                  auVar107._10_2_ = -(ushort)((short)uStack_17e < (short)uStack_a6);
                  auVar107._12_2_ = -(ushort)((short)uStack_17c < (short)local_a8);
                  auVar107._14_2_ = -(ushort)((short)uStack_17a < (short)uStack_a6);
                  auVar93._0_2_ = -(ushort)((short)local_68 < (short)uVar90);
                  auVar93._2_2_ = -(ushort)((short)uStack_66 < (short)uVar94);
                  auVar93._4_2_ = -(ushort)((short)local_68 < (short)uVar96);
                  auVar93._6_2_ = -(ushort)((short)uStack_66 < (short)uVar97);
                  auVar93._8_2_ = -(ushort)((short)local_68 < (short)uVar99);
                  auVar93._10_2_ = -(ushort)((short)uStack_66 < (short)uVar100);
                  auVar93._12_2_ = -(ushort)((short)local_68 < (short)uVar102);
                  auVar93._14_2_ = -(ushort)((short)uStack_66 < (short)uVar103);
                  auVar93 = auVar93 | auVar107;
                  if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar93 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar93 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar93 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar93 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar93 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar93 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar93 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar93 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar93 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar93 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar93[0xf]) {
                    sVar25 = (short)(uVar33 >> 0x30);
                    sVar44 = (short)(uVar35 >> 0x30);
                    sVar54 = (short)(uVar84 >> 0x30);
                    sVar55 = (short)(uVar75 >> 0x30);
                  }
                  else {
                    *(byte *)&ppVar28->flag = (byte)ppVar28->flag | 0x40;
                    sVar25 = 0;
                    sVar44 = 0;
                    sVar54 = 0;
                    sVar55 = 0;
                    iVar37 = 0;
                    uVar43 = 0;
                  }
                  ppVar28->score = (int)sVar25;
                  ppVar28->end_query = uVar43;
                  ppVar28->end_ref = iVar37;
                  *(int *)(ppVar28->field_4).extra = (int)sVar44;
                  ((ppVar28->field_4).stats)->similar = (int)sVar54;
                  ((ppVar28->field_4).stats)->length = (int)sVar55;
                  parasail_free(ptr_03);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(local_158);
                  parasail_free(ptr_00);
                  parasail_free(ptr_04);
                  parasail_free(palVar29);
                  parasail_free(b);
                  parasail_free(palVar30);
                  parasail_free(ptr);
                  return ppVar28;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}